

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

uint32_t handleQuantizeSmallerSig
                   (uint32_t abssrc,uint32_t npow2,uint32_t mask,float errTol,float srcFloat)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint in_EDX;
  int in_ESI;
  uint in_EDI;
  float in_XMM0_Da;
  float fVar4;
  float fVar5;
  float in_XMM1_Da;
  int srcbits;
  float delta1;
  float delta;
  int bits1;
  int bits0;
  uint32_t alt1;
  uint32_t alt0;
  uint local_40;
  
  local_40 = in_EDI & in_EDX;
  uVar1 = in_EDI + in_ESI & in_EDX;
  iVar2 = countSetBits((uint16_t)local_40);
  iVar3 = countSetBits((uint16_t)uVar1);
  if (iVar3 < iVar2) {
    fVar4 = half_to_float(0);
    if (fVar4 - in_XMM1_Da < in_XMM0_Da) {
      return uVar1;
    }
    fVar5 = half_to_float(0);
    fVar5 = in_XMM1_Da - fVar5;
    uVar1 = local_40;
  }
  else if (iVar3 == iVar2) {
    fVar4 = half_to_float(0);
    fVar5 = half_to_float(0);
    fVar5 = fVar5 - in_XMM1_Da;
    if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
      if (fVar5 < in_XMM1_Da - fVar4) {
        local_40 = uVar1;
      }
      return local_40;
    }
  }
  else {
    fVar4 = half_to_float(0);
    if (in_XMM1_Da - fVar4 < in_XMM0_Da) {
      return local_40;
    }
    iVar2 = countSetBits((uint16_t)in_EDI);
    if (iVar2 <= iVar3) {
      return in_EDI;
    }
    fVar5 = half_to_float(0);
    fVar5 = fVar5 - in_XMM1_Da;
  }
  if (in_XMM0_Da <= fVar5) {
    return in_EDI;
  }
  return uVar1;
}

Assistant:

static inline uint32_t handleQuantizeSmallerSig (
    uint32_t abssrc, uint32_t npow2, uint32_t mask, float errTol, float srcFloat)
{
    // in this case, only need to test two cases:
    //
    // base truncation and rounded truncation
    uint32_t alt0 = (abssrc & mask);
    uint32_t alt1 = ((abssrc + npow2) & mask);

    int bits0 = countSetBits (alt0);
    int bits1 = countSetBits (alt1);

    float delta;

    if (bits1 < bits0)
    {
        delta = half_to_float ((uint16_t)alt1) - srcFloat; // alt1 >= srcFloat
        // bits1 < bits0 and if ok, just return
        if (delta < errTol)
            return alt1;
        delta = srcFloat - half_to_float ((uint16_t)alt0); // alt0 <= srcFloat
        if (delta < errTol)
            return alt0;
    }
    else if (bits1 == bits0)
    {
        delta = srcFloat - half_to_float ((uint16_t)alt0);
        float delta1 = half_to_float ((uint16_t)alt1) - srcFloat;
        if (delta < errTol)
            return (delta1 < delta) ? alt1 : alt0;

        if (delta1 < errTol)
            return alt1;
    }
    else
    {
        delta = srcFloat - half_to_float ((uint16_t)alt0);
        // bits0 < bits1 so if ok, just return
        if (delta < errTol)
            return alt0;

        // fallback...
        // in this case, alt1 rounding could have made
        // bits1 larger than src, test for that
        int srcbits = countSetBits (abssrc);
        if (bits1 < srcbits)
        {
            delta = half_to_float ((uint16_t)alt1) - srcFloat;
            if (delta < errTol)
                return alt1;
        }
    }
    return abssrc;
}